

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O3

void lws_seq_destroy_all_on_pt(lws_context_per_thread *pt)

{
  lws_seq_t *plVar1;
  lws_seq_t *s;
  lws_seq_t *local_18;
  
  local_18 = (lws_seq_t *)(pt->seq_owner).head;
  if (local_18 != (lws_seq_t *)0x0) {
    do {
      plVar1 = (lws_seq_t *)(local_18->seq_list).next;
      lws_seq_destroy(&local_18);
      local_18 = plVar1;
    } while (plVar1 != (lws_seq_t *)0x0);
  }
  return;
}

Assistant:

void
lws_seq_destroy_all_on_pt(struct lws_context_per_thread *pt)
{
	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
				   pt->seq_owner.head) {
		lws_seq_t *s = lws_container_of(p, lws_seq_t,
						      seq_list);

		lws_seq_destroy(&s);

	} lws_end_foreach_dll_safe(p, tp);
}